

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  IO_INTERFACE_DESCRIPTION *pIVar2;
  XIO_HANDLE xio;
  CONNECTION_HANDLE connection_00;
  SESSION_HANDLE session_00;
  AMQP_VALUE source_00;
  LINK_HANDLE link_00;
  MESSAGE_RECEIVER_HANDLE message_receiver_00;
  size_t maximum_memory_used;
  size_t current_memory_used;
  XIO_HANDLE pXStack_c8;
  _Bool keep_running;
  SASLCLIENTIO_CONFIG sasl_io_config;
  XIO_HANDLE tls_io;
  IO_INTERFACE_DESCRIPTION *tlsio_interface;
  TLSIO_CONFIG tls_io_config;
  SASL_MECHANISM_HANDLE sasl_mechanism_handle;
  SASL_PLAIN_CONFIG sasl_plain_config;
  AMQP_VALUE target;
  AMQP_VALUE source;
  size_t last_memory_used;
  MESSAGE_RECEIVER_HANDLE message_receiver;
  LINK_HANDLE link;
  SESSION_HANDLE session;
  CONNECTION_HANDLE connection;
  XIO_HANDLE sasl_io;
  int result;
  char **argv_local;
  int argc_local;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    source = (AMQP_VALUE)0x0;
    sasl_mechanism_handle = (SASL_MECHANISM_HANDLE)anon_var_dwarf_23;
    sasl_plain_config.passwd = (char *)0x0;
    sasl_plain_config.authcid = "<<<Replace with your own key>>>";
    sasl_mechanism_interface_description = saslplain_get_interface();
    tls_io_config._32_8_ =
         saslmechanism_create(sasl_mechanism_interface_description,&sasl_mechanism_handle);
    tlsio_interface = (IO_INTERFACE_DESCRIPTION *)anon_var_dwarf_57;
    tls_io_config.hostname._0_4_ = 0x1627;
    tls_io_config.port = 0;
    tls_io_config._12_4_ = 0;
    tls_io_config.underlying_io_interface = (IO_INTERFACE_DESCRIPTION *)0x0;
    pIVar2 = platform_get_default_tlsio();
    pXStack_c8 = xio_create(pIVar2,&tlsio_interface);
    sasl_io_config.underlying_io = (XIO_HANDLE)tls_io_config._32_8_;
    sasl_io_config.sasl_mechanism = (SASL_MECHANISM_HANDLE)pXStack_c8;
    pIVar2 = saslclientio_get_interface_description();
    xio = xio_create(pIVar2,&stack0xffffffffffffff38);
    connection_00 =
         connection_create(xio,
                           "<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>"
                           ,"whatever",(ON_NEW_ENDPOINT)0x0,(void *)0x0);
    session_00 = session_create(connection_00,(ON_LINK_ATTACHED)0x0,(void *)0x0);
    session_set_incoming_window(session_00,100);
    source_00 = messaging_create_source
                          (
                          "amqps://<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>/<<<Insert your event hub name here>>>/ConsumerGroups/$Default/Partitions/0"
                          );
    sasl_plain_config.authzid = (char *)messaging_create_target("ingress-rx");
    link_00 = link_create(session_00,"receiver-link",true,source_00,
                          (AMQP_VALUE)sasl_plain_config.authzid);
    link_set_rcv_settle_mode(link_00,'\0');
    amqpvalue_destroy(source_00);
    amqpvalue_destroy((AMQP_VALUE)sasl_plain_config.authzid);
    message_receiver_00 =
         messagereceiver_create(link_00,(ON_MESSAGE_RECEIVER_STATE_CHANGED)0x0,(void *)0x0);
    if ((message_receiver_00 != (MESSAGE_RECEIVER_HANDLE)0x0) &&
       (iVar1 = messagereceiver_open(message_receiver_00,on_message_received,message_receiver_00),
       iVar1 == 0)) {
      do {
        do {
          connection_dowork(connection_00);
        } while (source == (AMQP_VALUE)0xffffffffffffffff);
        printf("Current memory usage:%lu (max:%lu)\r\n",0xffffffffffffffff,0xffffffffffffffff);
        source = (AMQP_VALUE)0xffffffffffffffff;
      } while( true );
    }
    printf("Cannot open the message receiver.");
    messagereceiver_destroy(message_receiver_00);
    link_destroy(link_00);
    session_destroy(session_00);
    connection_destroy(connection_00);
    platform_deinit();
    printf("Max memory usage:%lu\r\n",0xffffffffffffffff);
    printf("Current memory usage:%lu\r\n",0xffffffffffffffff);
  }
  return -1;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    XIO_HANDLE sasl_io = NULL;
    CONNECTION_HANDLE connection = NULL;
    SESSION_HANDLE session = NULL;
    LINK_HANDLE link = NULL;
    MESSAGE_RECEIVER_HANDLE message_receiver = NULL;

    (void)argc;
    (void)argv;

    if (platform_init() != 0)
    {
        result = -1;
    }
    else
    {
        size_t last_memory_used = 0;
        AMQP_VALUE source;
        AMQP_VALUE target;
        SASL_PLAIN_CONFIG sasl_plain_config;
        SASL_MECHANISM_HANDLE sasl_mechanism_handle;
        TLSIO_CONFIG tls_io_config;
        const IO_INTERFACE_DESCRIPTION* tlsio_interface;
        XIO_HANDLE tls_io;
        SASLCLIENTIO_CONFIG sasl_io_config;

        gballoc_init();

        /* create SASL plain handler */
        sasl_plain_config.authcid = EH_KEY_NAME;
        sasl_plain_config.authzid = NULL;
        sasl_plain_config.passwd = EH_KEY;

        sasl_mechanism_handle = saslmechanism_create(saslplain_get_interface(), &sasl_plain_config);

        /* create the TLS IO */
        tls_io_config.hostname = EH_HOST;
        tls_io_config.port = 5671;
        tls_io_config.underlying_io_interface = NULL;
        tls_io_config.underlying_io_parameters = NULL;

        tlsio_interface = platform_get_default_tlsio();
        tls_io = xio_create(tlsio_interface, &tls_io_config);

        /* create the SASL client IO using the TLS IO */
        sasl_io_config.underlying_io = tls_io;
        sasl_io_config.sasl_mechanism = sasl_mechanism_handle;
        sasl_io = xio_create(saslclientio_get_interface_description(), &sasl_io_config);

        /* create the connection, session and link */
        connection = connection_create(sasl_io, EH_HOST, "whatever", NULL, NULL);
        session = session_create(connection, NULL, NULL);

        /* set incoming window to 100 for the session */
        session_set_incoming_window(session, 100);

        /* listen only on partition 0 */
        source = messaging_create_source("amqps://" EH_HOST "/" EH_NAME "/ConsumerGroups/$Default/Partitions/0");
        target = messaging_create_target("ingress-rx");
        link = link_create(session, "receiver-link", role_receiver, source, target);
        link_set_rcv_settle_mode(link, receiver_settle_mode_first);
        amqpvalue_destroy(source);
        amqpvalue_destroy(target);

        /* create a message receiver */
        message_receiver = messagereceiver_create(link, NULL, NULL);
        if ((message_receiver == NULL) ||
            (messagereceiver_open(message_receiver, on_message_received, message_receiver) != 0))
        {
            (void)printf("Cannot open the message receiver.");
            result = -1;
        }
        else
        {
            bool keep_running = true;
            while (keep_running)
            {
                size_t current_memory_used;
                size_t maximum_memory_used;
                connection_dowork(connection);

                current_memory_used = gballoc_getCurrentMemoryUsed();
                maximum_memory_used = gballoc_getMaximumMemoryUsed();

                if (current_memory_used != last_memory_used)
                {
                    (void)printf("Current memory usage:%lu (max:%lu)\r\n", (unsigned long)current_memory_used, (unsigned long)maximum_memory_used);
                    last_memory_used = current_memory_used;
                }
            }

            result = 0;
        }

        messagereceiver_destroy(message_receiver);
        link_destroy(link);
        session_destroy(session);
        connection_destroy(connection);
        platform_deinit();

        (void)printf("Max memory usage:%lu\r\n", (unsigned long)gballoc_getCurrentMemoryUsed());
        (void)printf("Current memory usage:%lu\r\n", (unsigned long)gballoc_getMaximumMemoryUsed());

        gballoc_deinit();
    }

    return result;
}